

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_BuildAgainWithSyntax_Test::TestBody
          (FileDescriptorTest_BuildAgainWithSyntax_Test *this)

{
  Arena *arena;
  InternalMetadata IVar1;
  DescriptorPool *this_00;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  FileDescriptor *proto3_descriptor;
  FileDescriptor *implicit_proto2_descriptor;
  FileDescriptor *proto2_descriptor;
  FileDescriptorProto proto_syntax3;
  FileDescriptorProto implicit_proto2;
  FileDescriptorProto proto_syntax2;
  AssertHelper local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_340;
  undefined1 local_338 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  AssertHelper local_318;
  AssertHelper local_310;
  FileDescriptor *local_308;
  FileDescriptor *local_300;
  undefined1 local_2f8 [8];
  InternalMetadata local_2f0;
  undefined1 local_2e8 [200];
  ArenaStringPtr local_220 [4];
  undefined1 local_200 [8];
  InternalMetadata local_1f8;
  undefined1 local_1f0 [200];
  ArenaStringPtr local_128 [4];
  undefined1 local_108 [216];
  ArenaStringPtr local_30 [4];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0);
  local_108[0x10] = local_108[0x10] | 1;
  arena = (Arena *)local_108._8_8_;
  if ((local_108._8_8_ & 1) != 0) {
    arena = *(Arena **)(local_108._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo_syntax2";
  value._M_len = 0xb;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_108 + 200),value,arena);
  local_108[0x10] = local_108[0x10] | 4;
  if ((local_108._8_8_ & 1) != 0) {
    local_108._8_8_ = *(undefined8 *)(local_108._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "proto2";
  value_00._M_len = 6;
  protobuf::internal::ArenaStringPtr::Set(local_30,value_00,(Arena *)local_108._8_8_);
  this_00 = &(this->super_FileDescriptorTest).pool_;
  local_300 = DescriptorPool::BuildFile(this_00,(FileDescriptorProto *)local_108);
  local_2f8[0] = (internal)(local_300 != (FileDescriptor *)0x0);
  local_2f0.ptr_ = 0;
  if (local_300 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_200,(internal *)local_2f8,(AssertionResult *)0x10c5ad7,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1db,(char *)CONCAT71(local_200._1_7_,local_200[0]));
    testing::internal::AssertHelper::operator=(&local_350,(Message *)local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if ((undefined1 *)CONCAT71(local_200._1_7_,local_200[0]) != local_1f0) {
      operator_delete((undefined1 *)CONCAT71(local_200._1_7_,local_200[0]),
                      CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
    }
    if (local_338 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_338 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0.ptr_
                );
  }
  local_2f8 = (undefined1  [8])DescriptorPool::BuildFile(this_00,(FileDescriptorProto *)local_108);
  testing::internal::
  CmpHelperEQ<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
            ((internal *)local_200,"proto2_descriptor","pool_.BuildFile(proto_syntax2)",&local_300,
             (FileDescriptor **)local_2f8);
  if (local_200[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_1f8.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1dc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_338,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_338);
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8.ptr_
                );
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_200,(Arena *)0x0);
  local_1f0[0] = local_1f0[0] | 1;
  IVar1.ptr_ = local_1f8.ptr_;
  if ((local_1f8.ptr_ & 1U) != 0) {
    IVar1.ptr_ = *(undefined8 *)(local_1f8.ptr_ & 0xfffffffffffffffe);
  }
  value_01._M_str = "foo_implicit_syntax2";
  value_01._M_len = 0x14;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_1f0 + 0xb8),value_01,(Arena *)IVar1.ptr_);
  local_308 = DescriptorPool::BuildFile(this_00,(FileDescriptorProto *)local_200);
  local_338[0] = (internal)(local_308 != (FileDescriptor *)0x0);
  local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_308 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_350);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2f8,(internal *)local_338,
               (AssertionResult *)"implicit_proto2_descriptor != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1e3,(char *)local_2f8);
    testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    if (local_2f8 != (undefined1  [8])local_2e8) {
      operator_delete((void *)local_2f8,CONCAT71(local_2e8._1_7_,local_2e8[0]) + 1);
    }
    if (local_350.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_350.data_ + 8))();
    }
  }
  if (local_330 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_330,local_330);
  }
  local_1f0[0] = local_1f0[0] | 4;
  if ((local_1f8.ptr_ & 1U) != 0) {
    local_1f8.ptr_ = *(undefined8 *)(local_1f8.ptr_ & 0xfffffffffffffffe);
  }
  value_02._M_str = "proto2";
  value_02._M_len = 6;
  protobuf::internal::ArenaStringPtr::Set(local_128,value_02,(Arena *)local_1f8.ptr_);
  local_338 = (undefined1  [8])DescriptorPool::BuildFile(this_00,(FileDescriptorProto *)local_200);
  testing::internal::
  CmpHelperEQ<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
            ((internal *)local_2f8,"implicit_proto2_descriptor","pool_.BuildFile(implicit_proto2)",
             &local_308,(FileDescriptor **)local_338);
  if (local_2f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_338);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_2f0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1e7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_338 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_338 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0.ptr_
                );
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_2f8,(Arena *)0x0);
  local_2e8[0] = local_2e8[0] | 1;
  IVar1.ptr_ = local_2f0.ptr_;
  if ((local_2f0.ptr_ & 1U) != 0) {
    IVar1.ptr_ = *(undefined8 *)(local_2f0.ptr_ & 0xfffffffffffffffe);
  }
  value_03._M_str = "foo_syntax3";
  value_03._M_len = 0xb;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_2e8 + 0xb8),value_03,(Arena *)IVar1.ptr_);
  local_2e8[0] = local_2e8[0] | 4;
  IVar1.ptr_ = local_2f0.ptr_;
  if ((local_2f0.ptr_ & 1U) != 0) {
    IVar1.ptr_ = *(undefined8 *)(local_2f0.ptr_ & 0xfffffffffffffffe);
  }
  value_04._M_str = "proto3";
  value_04._M_len = 6;
  protobuf::internal::ArenaStringPtr::Set(local_220,value_04,(Arena *)IVar1.ptr_);
  local_318.data_ =
       (AssertHelperData *)DescriptorPool::BuildFile(this_00,(FileDescriptorProto *)local_2f8);
  local_350.data_._0_1_ = (FileDescriptor *)local_318.data_ != (FileDescriptor *)0x0;
  local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((FileDescriptor *)local_318.data_ == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_338,(internal *)&local_350,
               (AssertionResult *)"proto3_descriptor != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1ee,(char *)local_338);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    if (local_338 != (undefined1  [8])&local_328) {
      operator_delete((void *)local_338,local_328._M_allocated_capacity + 1);
    }
    if (local_340._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_340._M_head_impl + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  local_350.data_ =
       (AssertHelperData *)DescriptorPool::BuildFile(this_00,(FileDescriptorProto *)local_2f8);
  testing::internal::
  CmpHelperEQ<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
            ((internal *)local_338,"proto3_descriptor","pool_.BuildFile(proto_syntax3)",
             (FileDescriptor **)&local_318,(FileDescriptor **)&local_350);
  if (local_338[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_350);
    if (local_330 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_330->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_340,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_340);
    if ((FileDescriptor *)local_350.data_ != (FileDescriptor *)0x0) {
      (**(code **)(*(long *)local_350.data_ + 8))();
    }
  }
  if (local_330 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_330,local_330);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_2f8);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_200);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, BuildAgainWithSyntax) {
  // Test that if we call BuildFile again on the same input we get the same
  // FileDescriptor back even if syntax param is specified.
  FileDescriptorProto proto_syntax2;
  proto_syntax2.set_name("foo_syntax2");
  proto_syntax2.set_syntax("proto2");

  const FileDescriptor* proto2_descriptor = pool_.BuildFile(proto_syntax2);
  EXPECT_TRUE(proto2_descriptor != nullptr);
  EXPECT_EQ(proto2_descriptor, pool_.BuildFile(proto_syntax2));

  FileDescriptorProto implicit_proto2;
  implicit_proto2.set_name("foo_implicit_syntax2");

  const FileDescriptor* implicit_proto2_descriptor =
      pool_.BuildFile(implicit_proto2);
  EXPECT_TRUE(implicit_proto2_descriptor != nullptr);
  // We get the same FileDescriptor back if syntax param is explicitly
  // specified.
  implicit_proto2.set_syntax("proto2");
  EXPECT_EQ(implicit_proto2_descriptor, pool_.BuildFile(implicit_proto2));

  FileDescriptorProto proto_syntax3;
  proto_syntax3.set_name("foo_syntax3");
  proto_syntax3.set_syntax("proto3");

  const FileDescriptor* proto3_descriptor = pool_.BuildFile(proto_syntax3);
  EXPECT_TRUE(proto3_descriptor != nullptr);
  EXPECT_EQ(proto3_descriptor, pool_.BuildFile(proto_syntax3));
}